

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::CodeGeneratorRequest::SharedDtor(MessageLite *self)

{
  Version *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  CodeGeneratorRequest *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (CodeGeneratorRequest *)self;
  protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 6));
    this = (Version *)local_18[6]._internal_metadata_.ptr_;
    if (this != (Version *)0x0) {
      Version::~Version(this);
      operator_delete(this,0x30);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
             ,0x2c3,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void CodeGeneratorRequest::SharedDtor(MessageLite& self) {
  CodeGeneratorRequest& this_ = static_cast<CodeGeneratorRequest&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.parameter_.Destroy();
  delete this_._impl_.compiler_version_;
  this_._impl_.~Impl_();
}